

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall t_netstd_generator::generate_struct(t_netstd_generator *this,t_struct *tstruct)

{
  collect_extensions_types(this,tstruct);
  if ((this->union_ == true) && (tstruct->is_union_ == true)) {
    generate_netstd_union(this,tstruct);
    return;
  }
  generate_netstd_struct(this,tstruct,false);
  return;
}

Assistant:

void t_netstd_generator::generate_struct(t_struct* tstruct)
{
    collect_extensions_types(tstruct);

    if (is_union_enabled() && tstruct->is_union())
    {
        generate_netstd_union(tstruct);
    }
    else
    {
        generate_netstd_struct(tstruct, false);
    }
}